

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

long kj::anon_unknown_39::parseInteger<long>(StringPtr *s)

{
  long min_00;
  long max_00;
  longlong lVar1;
  longlong max;
  longlong min;
  StringPtr *s_local;
  
  min_00 = MinValue_::operator_cast_to_long((MinValue_ *)&minValue);
  max_00 = MaxValue_::operator_cast_to_long((MaxValue_ *)&maxValue);
  lVar1 = parseSigned(s,min_00,max_00);
  return lVar1;
}

Assistant:

T parseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<T>(parseUnsigned(s, max));
  }
}